

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void indexed_store(Proc *proc,Pseudo *index_pseudo,Pseudo *value_pseudo,ravitype_t value_type)

{
  uint uVar1;
  ravitype_t rVar2;
  Pseudo *pseudo;
  Pseudo *pseudo_00;
  Instruction *insn_00;
  Pseudo *pseudo_01;
  Pseudo *tofree;
  Instruction *insn;
  Pseudo *key_pseudo;
  Pseudo *container_pseudo;
  uint line_number;
  ravitype_t index_type;
  ravitype_t table_type;
  int op;
  ravitype_t value_type_local;
  Pseudo *value_pseudo_local;
  Pseudo *index_pseudo_local;
  Proc *proc_local;
  
  if (((undefined1  [48])*index_pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    __assert_fail("index_pseudo->type == PSEUDO_INDEXED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0x592,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
  }
  if ((undefined1  [40])((undefined1  [40])index_pseudo->field_3 & (undefined1  [40])0x100000000) ==
      (undefined1  [40])0x0) {
    uVar1 = (index_pseudo->field_3).range_in_use;
    rVar2 = (index_pseudo->field_3).index_info.key_type;
    if (uVar1 == 0x20) {
      index_type = RAVI_TARRAYFLT|RAVI_TTRUE;
      if (value_type == RAVI_TNUMINT) {
        index_type = RAVI_TARRAYFLT|RAVI_TTRUE|RAVI_TNIL;
      }
    }
    else if (uVar1 == 0x40) {
      index_type = RAVI_TARRAYFLT|RAVI_TTRUE|RAVI_TFALSE;
      if (value_type == RAVI_TNUMFLT) {
        index_type = RAVI_TARRAYFLT|RAVI_TBOOLEAN;
      }
    }
    else {
      index_type = RAVI_TARRAYINT|RAVI_TNUMBER|RAVI_TTRUE|RAVI_TFALSE;
      if (uVar1 == 0x80) {
        index_type = RAVI_TARRAYFLT|RAVI_TNIL;
      }
      if (rVar2 == RAVI_TNUMINT) {
        index_type = index_type + RAVI_TNIL;
      }
      else if (rVar2 == RAVI_TSTRING) {
        index_type = index_type + RAVI_TFALSE;
      }
    }
    pseudo = (index_pseudo->field_3).index_info.container;
    pseudo_00 = (index_pseudo->field_3).index_info.key;
    if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0x5b4,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
    }
    if (((undefined1  [48])*pseudo_00 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0x5b5,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
    }
    insn_00 = allocate_instruction(proc,index_type,(index_pseudo->field_3).index_info.line_number);
    pseudo_01 = add_instruction_operand(proc,insn_00,value_pseudo);
    add_instruction_target(proc,insn_00,pseudo);
    add_instruction_target(proc,insn_00,pseudo_00);
    add_instruction(proc,insn_00);
    if (pseudo_01 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pseudo_01,false);
    }
  }
  else {
    indexed_store_to_global(proc,index_pseudo,value_pseudo,value_type);
  }
  return;
}

Assistant:

static void indexed_store(Proc *proc, Pseudo *index_pseudo, Pseudo *value_pseudo,
				    ravitype_t value_type)
{
	assert(index_pseudo->type == PSEUDO_INDEXED);
	if (index_pseudo->index_info.is_global) {
		indexed_store_to_global(proc, index_pseudo, value_pseudo, value_type);
		return;
	}
	int op;
	ravitype_t table_type = index_pseudo->index_info.container_type;
	ravitype_t index_type = index_pseudo->index_info.key_type;
	switch (table_type) {
	case RAVI_TARRAYINT:
		op = op_iaput;
		if (value_type == RAVI_TNUMINT) {
			op = op_iaput_ival;
		}
		break;
	case RAVI_TARRAYFLT:
		op = op_faput;
		if (value_type == RAVI_TNUMFLT) {
			op = op_faput_fval;
		}
		break;
	default:
		op = table_type == RAVI_TTABLE ? op_tput : op_put;
		if (index_type == RAVI_TNUMINT) {
			op += 1;
		} else if (index_type == RAVI_TSTRING) {
			op += 2;
		}
		break;
	}
	unsigned line_number = index_pseudo->index_info.line_number;
	Pseudo *container_pseudo = index_pseudo->index_info.container;
	Pseudo *key_pseudo = index_pseudo->index_info.key;

	assert(container_pseudo->type != PSEUDO_INDEXED);
	assert(key_pseudo->type != PSEUDO_INDEXED);

	Instruction *insn = allocate_instruction(proc, op, line_number);
	Pseudo *tofree = add_instruction_operand(proc, insn, value_pseudo);
	add_instruction_target(proc, insn, container_pseudo);
	add_instruction_target(proc, insn, key_pseudo);
	add_instruction(proc, insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
}